

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

bool vera::isGL(void)

{
  int iVar1;
  
  iVar1 = glfwWindowShouldClose(window);
  return iVar1 == 0;
}

Assistant:

bool isGL() {
 
#if defined(DRIVER_GLFW)
    return !glfwWindowShouldClose(window);

#elif defined(DRIVER_BROADCOM)
    return bHostInited;

#elif defined(DRIVER_GBM)
    return true;

#endif

    return false;
}